

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::DescriptorScalarReplacement::ReplaceAccessChain
          (DescriptorScalarReplacement *this,Instruction *var,Instruction *use)

{
  initializer_list<unsigned_int> init_list;
  uint32_t uVar1;
  IRContext *pIVar2;
  Operand *pOVar3;
  uint local_110;
  uint32_t local_10c;
  uint32_t i;
  undefined8 local_100;
  SmallVector<unsigned_int,_2UL> local_f8;
  Operand local_d0;
  undefined1 local_a0 [8];
  OperandList new_operands;
  uint32_t replacement_var;
  uint32_t idx;
  Constant *local_58;
  Constant *const_index;
  string local_48;
  Instruction *local_28;
  Instruction *use_local;
  Instruction *var_local;
  DescriptorScalarReplacement *this_local;
  
  local_28 = use;
  use_local = var;
  var_local = (Instruction *)this;
  uVar1 = Instruction::NumInOperands(use);
  if (uVar1 < 2) {
    pIVar2 = Pass::context(&this->super_Pass);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Variable cannot be replaced: invalid instruction",
               (allocator<char> *)((long)&const_index + 7));
    IRContext::EmitErrorMessage(pIVar2,&local_48,local_28);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)((long)&const_index + 7));
    this_local._7_1_ = 0;
  }
  else {
    pIVar2 = Pass::context(&this->super_Pass);
    local_58 = descsroautil::GetAccessChainIndexAsConst(pIVar2,local_28);
    if (local_58 == (Constant *)0x0) {
      pIVar2 = Pass::context(&this->super_Pass);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&idx,"Variable cannot be replaced: invalid index",
                 (allocator<char> *)((long)&replacement_var + 3));
      IRContext::EmitErrorMessage(pIVar2,(string *)&idx,local_28);
      std::__cxx11::string::~string((string *)&idx);
      std::allocator<char>::~allocator((allocator<char> *)((long)&replacement_var + 3));
      this_local._7_1_ = 0;
    }
    else {
      uVar1 = analysis::Constant::GetU32(local_58);
      new_operands.
      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = GetReplacementVariable(this,use_local,uVar1)
      ;
      uVar1 = Instruction::NumInOperands(local_28);
      if (uVar1 == 2) {
        pIVar2 = Pass::context(&this->super_Pass);
        uVar1 = Instruction::result_id(local_28);
        IRContext::ReplaceAllUsesWith
                  (pIVar2,uVar1,
                   new_operands.
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        pIVar2 = Pass::context(&this->super_Pass);
        IRContext::KillInst(pIVar2,local_28);
        this_local._7_1_ = 1;
      }
      else {
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   local_a0);
        pOVar3 = Instruction::GetOperand(local_28,0);
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        emplace_back<spvtools::opt::Operand&>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)local_a0
                   ,pOVar3);
        pOVar3 = Instruction::GetOperand(local_28,1);
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        emplace_back<spvtools::opt::Operand&>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)local_a0
                   ,pOVar3);
        local_10c = new_operands.
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        _i = &local_10c;
        local_100 = 1;
        init_list._M_len = 1;
        init_list._M_array = _i;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_f8,init_list);
        Operand::Operand(&local_d0,SPV_OPERAND_TYPE_ID,&local_f8);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   local_a0,&local_d0);
        Operand::~Operand(&local_d0);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_f8);
        local_110 = 4;
        while( true ) {
          uVar1 = Instruction::NumOperands(local_28);
          if (uVar1 <= local_110) break;
          pOVar3 = Instruction::GetOperand(local_28,local_110);
          std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
          emplace_back<spvtools::opt::Operand&>
                    ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                     local_a0,pOVar3);
          local_110 = local_110 + 1;
        }
        Instruction::ReplaceOperands(local_28,(OperandList *)local_a0);
        pIVar2 = Pass::context(&this->super_Pass);
        IRContext::UpdateDefUse(pIVar2,local_28);
        this_local._7_1_ = 1;
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   local_a0);
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool DescriptorScalarReplacement::ReplaceAccessChain(Instruction* var,
                                                     Instruction* use) {
  if (use->NumInOperands() <= 1) {
    context()->EmitErrorMessage(
        "Variable cannot be replaced: invalid instruction", use);
    return false;
  }

  const analysis::Constant* const_index =
      descsroautil::GetAccessChainIndexAsConst(context(), use);
  if (const_index == nullptr) {
    context()->EmitErrorMessage("Variable cannot be replaced: invalid index",
                                use);
    return false;
  }

  uint32_t idx = const_index->GetU32();
  uint32_t replacement_var = GetReplacementVariable(var, idx);

  if (use->NumInOperands() == 2) {
    // We are not indexing into the replacement variable.  We can replaces the
    // access chain with the replacement variable itself.
    context()->ReplaceAllUsesWith(use->result_id(), replacement_var);
    context()->KillInst(use);
    return true;
  }

  // We need to build a new access chain with the replacement variable as the
  // base address.
  Instruction::OperandList new_operands;

  // Same result id and result type.
  new_operands.emplace_back(use->GetOperand(0));
  new_operands.emplace_back(use->GetOperand(1));

  // Use the replacement variable as the base address.
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {replacement_var}});

  // Drop the first index because it is consumed by the replacement, and copy
  // the rest.
  for (uint32_t i = 4; i < use->NumOperands(); i++) {
    new_operands.emplace_back(use->GetOperand(i));
  }

  use->ReplaceOperands(new_operands);
  context()->UpdateDefUse(use);
  return true;
}